

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRampFlightType::IfcRampFlightType(IfcRampFlightType *this)

{
  IfcRampFlightType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcRampFlightType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__01082120);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>,
             &PTR_construction_vtable_24__01082258);
  *(undefined8 *)this = 0x1081ff0;
  *(undefined8 *)&this->field_0x1c0 = 0x1082108;
  *(undefined8 *)&this->field_0x88 = 0x1082018;
  *(undefined8 *)&this->field_0x98 = 0x1082040;
  *(undefined8 *)&this->field_0xf0 = 0x1082068;
  *(undefined8 *)&this->field_0x148 = 0x1082090;
  *(undefined8 *)&this->field_0x180 = 0x10820b8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x10820e0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x10
            );
  return;
}

Assistant:

IfcRampFlightType() : Object("IfcRampFlightType") {}